

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcd2.c
# Opt level: O1

int bcd2_sub(long *bcd_low,long *bcd_high,long subend)

{
  long lVar1;
  byte bVar2;
  byte bVar3;
  uint *puVar4;
  ulong uVar5;
  long lVar6;
  ulong *puVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  long tmp_hi;
  long tmp_lo;
  uint local_30 [2];
  uint local_28 [2];
  
  bin_bcd2(subend,(long *)local_28,(long *)local_30);
  bVar2 = 0;
  uVar5 = 0;
  lVar1 = 0;
  do {
    puVar4 = (uint *)bcd_low;
    if (6 < uVar5) {
      puVar4 = (uint *)bcd_high;
    }
    uVar9 = local_28[0];
    bVar3 = bVar2;
    if (6 < uVar5) {
      uVar9 = local_30[0];
      bVar3 = bVar2 - 0x1c;
    }
    uVar8 = 0xf << (bVar3 & 0x1f);
    lVar10 = (ulong)((uVar8 & *puVar4) >> (bVar3 & 0x3f)) -
             ((ulong)((uVar9 & uVar8) >> (bVar3 & 0x3f)) + lVar1);
    if (lVar10 < 0) {
      lVar1 = 1;
    }
    lVar6 = lVar10 + 10;
    if (lVar10 >= 0) {
      lVar6 = lVar10;
    }
    if (uVar5 < 7) {
      uVar9 = (0xf << (bVar2 & 0x1f) ^ 0xfffffffU) & (uint)*bcd_low;
      puVar7 = (ulong *)bcd_low;
      bVar3 = bVar2;
    }
    else {
      uVar9 = (0xf << (bVar2 - 0x1c & 0x1f) ^ 0xfffffffU) & (uint)*bcd_high;
      puVar7 = (ulong *)bcd_high;
      bVar3 = (char)uVar5 * '\x04' - 0x1c;
    }
    *puVar7 = lVar6 << (bVar3 & 0x3f) | (ulong)uVar9;
    uVar5 = uVar5 + 1;
    bVar2 = bVar2 + 4;
  } while (uVar5 != 0xe);
  return (int)lVar1;
}

Assistant:

int
bcd2_sub(long *bcd_low, long *bcd_high, long subend)
{
    long tmp_lo, tmp_hi, carry, res;
    int digit;

    bin_bcd2(subend, &tmp_lo, &tmp_hi);
    carry = 0;
    for (digit=0; digit < 14; digit++)
        {
        res = GET_DIGIT(digit, *bcd_low, *bcd_high); 
        res -= GET_DIGIT(digit, tmp_lo, tmp_hi);
        res -= carry;
        if (res < 0) 
			{
			res += 10;
			carry = 1;
			}
        SET_DIGIT(res, digit, bcd_low, bcd_high);
        }
    return(carry);
}